

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_filehandle.cc
# Opt level: O3

RC __thiscall PF_FileHandle::AllocatePage(PF_FileHandle *this,PF_PageHandle *pageHandle)

{
  int *piVar1;
  RC RVar2;
  int *in_RAX;
  int pageNum;
  char *pPageBuf;
  int *local_28;
  
  if (this->bFileOpen == 0) {
    RVar2 = 5;
  }
  else {
    pageNum = (this->hdr).firstFree;
    local_28 = in_RAX;
    if (pageNum == -1) {
      pageNum = (this->hdr).numPages;
      RVar2 = PF_BufferMgr::AllocatePage(this->pBufferMgr,this->unixfd,pageNum,(char **)&local_28);
      if (RVar2 != 0) {
        return RVar2;
      }
      piVar1 = &(this->hdr).numPages;
      *piVar1 = *piVar1 + 1;
    }
    else {
      RVar2 = PF_BufferMgr::GetPage(this->pBufferMgr,this->unixfd,pageNum,(char **)&local_28,1);
      if (RVar2 != 0) {
        return RVar2;
      }
      (this->hdr).firstFree = *local_28;
    }
    this->bHdrChanged = 1;
    *local_28 = -2;
    memset(local_28 + 1,0,0xffc);
    RVar2 = MarkDirty(this,pageNum);
    if (RVar2 == 0) {
      pageHandle->pageNum = pageNum;
      pageHandle->pPageData = (char *)(local_28 + 1);
      RVar2 = 0;
    }
  }
  return RVar2;
}

Assistant:

RC PF_FileHandle::AllocatePage(PF_PageHandle &pageHandle)
{
   int     rc;               // return code
   int     pageNum;          // new-page number
   char    *pPageBuf;        // address of page in buffer pool

   // File must be open
   if (!bFileOpen)
      return (PF_CLOSEDFILE);

   // If the free list isn't empty...
   if (hdr.firstFree != PF_PAGE_LIST_END) {
      pageNum = hdr.firstFree;

      // Get the first free page into the buffer
      if ((rc = pBufferMgr->GetPage(unixfd,
            pageNum,
            &pPageBuf)))
         return (rc);

      // Set the first free page to the next page on the free list
      hdr.firstFree = ((PF_PageHdr*)pPageBuf)->nextFree;
   }
   else {

      // The free list is empty...
      pageNum = hdr.numPages;

      // Allocate a new page in the file
      if ((rc = pBufferMgr->AllocatePage(unixfd,
            pageNum,
            &pPageBuf)))
         return (rc);

      // Increment the number of pages for this file
      hdr.numPages++;
   }

   // Mark the header as changed
   bHdrChanged = TRUE;

   // Mark this page as used
   ((PF_PageHdr *)pPageBuf)->nextFree = PF_PAGE_USED;

   // Zero out the page data
   memset(pPageBuf + sizeof(PF_PageHdr), 0, PF_PAGE_SIZE);

   // Mark the page dirty because we changed the next pointer
   if ((rc = MarkDirty(pageNum)))
      return (rc);

   // Set the pageHandle local variables
   pageHandle.pageNum = pageNum;
   pageHandle.pPageData = pPageBuf + sizeof(PF_PageHdr);

   // Return ok
   return (0);
}